

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

void __thiscall
flatbuffers::java::JavaGenerator::GenUnionUnPack_ObjectAPI
          (JavaGenerator *this,EnumDef *enum_def,string *code,string *type_name,string *field_name,
          bool is_vector)

{
  BaseType BVar1;
  EnumVal *v;
  int iVar2;
  pointer ppEVar3;
  char *pcVar4;
  char *__s;
  undefined3 in_register_00000089;
  string actual_type;
  string indent;
  string variable_name;
  string value_params;
  string type_params;
  string variable_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string *local_1e8;
  EnumDef *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  int local_154;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Namer *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  JavaGenerator *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1e8 = field_name;
  local_1e0 = enum_def;
  if (CONCAT31(in_register_00000089,is_vector) == 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)type_name);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)type_name);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"o",(allocator<char> *)&local_248);
  local_110 = &(this->namer_).super_Namer;
  Namer::Variable(&local_c8,local_110,&local_1b8,local_1e8);
  std::operator+(&local_90,"_",&local_c8);
  pcVar4 = "Element";
  __s = "";
  if (!is_vector) {
    pcVar4 = "";
  }
  std::operator+(&local_130,&local_90,pcVar4);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_1b8);
  pcVar4 = "_j";
  if (!is_vector) {
    pcVar4 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,pcVar4,(allocator<char> *)&local_c8);
  if (is_vector) {
    __s = ", _j";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,__s,(allocator<char> *)&local_1b8);
  pcVar4 = "    ";
  if (is_vector) {
    pcVar4 = "      ";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,pcVar4,(allocator<char> *)&local_248);
  std::operator+(&local_198,&local_1b8,&local_50);
  std::operator+(&local_178,&local_198," ");
  std::operator+(&local_1d8,&local_178,&local_130);
  std::operator+(&local_208,&local_1d8," = new ");
  std::operator+(&local_228,&local_208,&local_50);
  std::operator+(&local_248,&local_228,"();\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  DestinationType(&local_70,this,&local_1e0->underlying_type,false);
  GenTypeBasic_abi_cxx11_(&local_e8,this,&local_70);
  std::operator+(&local_108,&local_1b8,&local_e8);
  std::operator+(&local_150,&local_108," ");
  std::operator+(&local_198,&local_150,&local_130);
  std::operator+(&local_178,&local_198,"Type = ");
  std::operator+(&local_1d8,&local_178,local_1e8);
  std::operator+(&local_208,&local_1d8,"Type(");
  std::operator+(&local_228,&local_208,&local_90);
  std::operator+(&local_248,&local_228,");\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::operator+(&local_1d8,&local_1b8,&local_130);
  std::operator+(&local_208,&local_1d8,".setType(");
  std::operator+(&local_228,&local_208,&local_130);
  std::operator+(&local_248,&local_228,"Type);\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::operator+(&local_208,&local_1b8,"Table ");
  std::operator+(&local_228,&local_208,&local_130);
  std::operator+(&local_248,&local_228,"Value;\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::operator+(&local_208,&local_1b8,"switch (");
  std::operator+(&local_228,&local_208,&local_130);
  std::operator+(&local_248,&local_228,"Type) {\n");
  local_154 = CONCAT31(in_register_00000089,is_vector);
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  local_a0 = &this->package_prefix_;
  ppEVar3 = (local_1e0->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_a8 = this;
  while (ppEVar3 !=
         (local_1e0->vals).vec.
         super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl
         .super__Vector_impl_data._M_finish) {
    v = *ppEVar3;
    BVar1 = (v->union_type).base_type;
    local_98 = ppEVar3;
    if (((BVar1 != BASE_TYPE_NONE) && (BVar1 != BASE_TYPE_STRING)) &&
       ((BVar1 != BASE_TYPE_STRUCT || (((v->union_type).struct_def)->fixed == false)))) {
      std::operator+(&local_208,&local_1b8,"  case ");
      IdlNamer::NamespacedEnumVariant_abi_cxx11_(&local_178,(IdlNamer *)local_110,local_1e0,v);
      std::operator+(&local_1d8,local_a0,&local_178);
      std::operator+(&local_228,&local_208,&local_1d8);
      std::operator+(&local_248,&local_228,":\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_208);
      GenTypeGet_abi_cxx11_(&local_248,local_a8,&v->union_type);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_1b8,"    ");
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_130);
      std::operator+(&local_108,&local_e8,"Value = ");
      std::operator+(&local_150,&local_108,local_1e8);
      std::operator+(&local_198,&local_150,"(new ");
      std::operator+(&local_178,&local_198,&local_248);
      std::operator+(&local_1d8,&local_178,"()");
      std::operator+(&local_208,&local_1d8,&local_c8);
      std::operator+(&local_228,&local_208,");\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_1b8,"    ");
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_130);
      std::operator+(&local_108,&local_e8,".setValue(");
      std::operator+(&local_150,&local_108,&local_130);
      std::operator+(&local_198,&local_150,"Value != null ? ((");
      std::operator+(&local_178,&local_198,&local_248);
      std::operator+(&local_1d8,&local_178,") ");
      std::operator+(&local_208,&local_1d8,&local_130);
      std::operator+(&local_228,&local_208,"Value).unpack() : null);\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_70);
      std::operator+(&local_228,&local_1b8,"    break;\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
    }
    ppEVar3 = local_98 + 1;
  }
  std::operator+(&local_248,&local_1b8,"  default: break;\n");
  std::__cxx11::string::append((string *)code);
  iVar2 = local_154;
  std::__cxx11::string::~string((string *)&local_248);
  std::operator+(&local_248,&local_1b8,"}\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_248);
  if ((char)iVar2 != '\0') {
    std::operator+(&local_178,&local_1b8,"_");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"o",(allocator<char> *)&local_108);
    Namer::Variable(&local_198,local_110,&local_150,local_1e8);
    std::operator+(&local_1d8,&local_178,&local_198);
    std::operator+(&local_208,&local_1d8,"[_j] = ");
    std::operator+(&local_228,&local_208,&local_130);
    std::operator+(&local_248,&local_228,";\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_178);
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void GenUnionUnPack_ObjectAPI(const EnumDef &enum_def, std::string &code,
                                const std::string &type_name,
                                const std::string &field_name,
                                bool is_vector) const {
    const std::string variable_type =
        is_vector ? type_name.substr(0, type_name.length() - 2) : type_name;
    const std::string variable_name =
        "_" + namer_.Variable("o", field_name) + (is_vector ? "Element" : "");
    const std::string type_params = is_vector ? "_j" : "";
    const std::string value_params = is_vector ? ", _j" : "";
    const std::string indent = (is_vector ? "      " : "    ");

    code += indent + variable_type + " " + variable_name + " = new " +
            variable_type + "();\n";
    code += indent +
            GenTypeBasic(DestinationType(enum_def.underlying_type, false)) +
            " " + variable_name + "Type = " + field_name + "Type(" +
            type_params + ");\n";
    code += indent + variable_name + ".setType(" + variable_name + "Type);\n";
    code += indent + "Table " + variable_name + "Value;\n";
    code += indent + "switch (" + variable_name + "Type) {\n";
    for (auto eit = enum_def.Vals().begin(); eit != enum_def.Vals().end();
         ++eit) {
      auto &ev = **eit;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        continue;
      } else {
        if (ev.union_type.base_type == BASE_TYPE_STRING ||
            (ev.union_type.base_type == BASE_TYPE_STRUCT &&
             ev.union_type.struct_def->fixed)) {
          continue;  // This branch is due to bad implemantation of Unions in
                     // Java which doesn't handle non Table types. Should be
                     // deleted when issue #6561 is fixed.
        }
        code += indent + "  case " +
                Prefixed(namer_.NamespacedEnumVariant(enum_def, ev)) + ":\n";
        auto actual_type = GenTypeGet(ev.union_type);
        code += indent + "    " + variable_name + "Value = " + field_name +
                "(new " + actual_type + "()" + value_params + ");\n";
        code += indent + "    " + variable_name + ".setValue(" + variable_name +
                "Value != null ? ((" + actual_type + ") " + variable_name +
                "Value).unpack() : null);\n";
        code += indent + "    break;\n";
      }
    }
    code += indent + "  default: break;\n";
    code += indent + "}\n";
    if (is_vector) {
      code += indent + "_" + namer_.Variable("o", field_name) +
              "[_j] = " + variable_name + ";\n";
    }
  }